

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  long lVar1;
  PaAlsaHostApiRepresentation *pPVar2;
  PaUtilAllocationGroup *pPVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  byte *pbVar7;
  HwDevInfo *__ptr;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  byte *pbVar14;
  char *pcVar15;
  snd_config_t *psVar16;
  snd_config_t *psVar17;
  snd_config_t *psVar18;
  undefined8 uVar19;
  HwDevInfo *pHVar20;
  PaDeviceInfo **ppPVar21;
  PaAlsaDeviceInfo *devInfo;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar22;
  PaError PVar23;
  PaAlsaDeviceInfo *devInfo_00;
  char *pcVar24;
  char *pcVar25;
  byte bVar26;
  byte *pbVar27;
  byte *pbVar28;
  byte bVar29;
  byte bVar30;
  long lVar31;
  char *pcVar32;
  char acStack_130 [16];
  char alsaCardName [50];
  char *local_e8;
  char buf [50];
  char *local_a8;
  char *alsaDeviceName;
  char *local_98;
  undefined8 local_90;
  snd_config_t *topNode;
  int local_80;
  uint local_7c;
  char *local_78;
  char *local_70;
  uint local_64;
  PaAlsaHostApiRepresentation *local_60;
  byte *local_58;
  char *cardName;
  undefined8 local_48;
  snd_ctl_t *ctl;
  int devIdx;
  int devIdx_1;
  
  ctl._0_4_ = 0;
  local_90 = 0;
  acStack_130[0] = '=';
  acStack_130[1] = -0x62;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  pcVar11 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar11 == (char *)0x0) {
    local_64 = 1;
  }
  else {
    acStack_130[0] = 'J';
    acStack_130[1] = -0x62;
    acStack_130[2] = '\x10';
    acStack_130[3] = '\0';
    acStack_130[4] = '\0';
    acStack_130[5] = '\0';
    acStack_130[6] = '\0';
    acStack_130[7] = '\0';
    iVar8 = atoi(pcVar11);
    local_64 = (uint)(iVar8 == 0);
  }
  acStack_130[0] = 'i';
  acStack_130[1] = -0x62;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  pcVar11 = getenv("PA_ALSA_PLUGHW");
  if (pcVar11 == (char *)0x0) {
    local_7c = 0;
    local_70 = "";
  }
  else {
    acStack_130[0] = 'v';
    acStack_130[1] = -0x62;
    acStack_130[2] = '\x10';
    acStack_130[3] = '\0';
    acStack_130[4] = '\0';
    acStack_130[5] = '\0';
    acStack_130[6] = '\0';
    acStack_130[7] = '\0';
    iVar8 = atoi(pcVar11);
    local_7c = (uint)(iVar8 != 0);
    local_70 = "";
    if (iVar8 != 0) {
      local_70 = "plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  local_80 = -1;
  builtin_strncpy(acStack_130,"^\x10",4);
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  sVar12 = snd_ctl_card_info_sizeof();
  lVar1 = -(sVar12 + 0xf & 0xfffffffffffffff0);
  pcVar11 = acStack_130 + lVar1 + 8;
  _devIdx = (HwDevInfo *)0x0;
  pcVar24 = acStack_130 + lVar1;
  local_98 = pcVar11;
  pcVar24[0] = -0x15;
  pcVar24[1] = -0x62;
  pcVar24[2] = '\x10';
  pcVar24[3] = '\0';
  pcVar24[4] = '\0';
  pcVar24[5] = '\0';
  pcVar24[6] = '\0';
  pcVar24[7] = '\0';
  memset(pcVar11,0,sVar12);
  pcVar25 = acStack_130 + lVar1;
  pcVar25[0] = -0x10;
  pcVar25[1] = -0x62;
  pcVar25[2] = '\x10';
  pcVar25[3] = '\0';
  pcVar25[4] = '\0';
  pcVar25[5] = '\0';
  pcVar25[6] = '\0';
  pcVar25[7] = '\0';
  sVar12 = snd_pcm_info_sizeof();
  lVar4 = -(sVar12 + 0xf & 0xfffffffffffffff0);
  pcVar11 = pcVar11 + lVar4;
  pcVar11[-8] = '\x0e';
  pcVar11[-7] = -0x61;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  memset(pcVar11,0,sVar12);
  pcVar11[-8] = '\x16';
  pcVar11[-7] = -0x61;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  iVar8 = snd_card_next(&local_80);
  local_60 = alsaApi;
  if (local_80 < 0 || iVar8 != 0) {
    local_78 = (char *)0x1;
    pcVar32 = (char *)0x0;
  }
  else {
    local_78 = (char *)0x1;
    pcVar32 = (char *)0x0;
    _devIdx = (HwDevInfo *)0x0;
    pcVar15 = pcVar11;
    alsaDeviceName = pcVar11;
    do {
      ctl._4_4_ = -1;
      pcVar11[-8] = 'p';
      pcVar11[-7] = -0x61;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      snprintf(acStack_130 + 8,0x32,"hw:%d");
      pcVar11[-8] = '~';
      pcVar11[-7] = -0x61;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      iVar8 = snd_ctl_open(&local_48,acStack_130 + 8,0);
      uVar5 = local_48;
      pcVar13 = local_98;
      if (-1 < iVar8) {
        pcVar11[-8] = -0x67;
        pcVar11[-7] = -0x61;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        snd_ctl_card_info(uVar5,pcVar13);
        pcVar11[-8] = -0x5f;
        pcVar11[-7] = -0x61;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        pcVar13 = (char *)snd_ctl_card_info_get_name(pcVar13);
        pPVar2 = (PaAlsaHostApiRepresentation *)alsaApi->allocations;
        pcVar11[-8] = -0x4c;
        pcVar11[-7] = -0x61;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(pPVar2,(char **)&local_58,pcVar13);
        uVar5 = local_48;
        if (paUtilErr_ < 0) {
          pcVar32 = 
          "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1291\n"
          ;
LAB_0010a676:
          pcVar11[-8] = '}';
          pcVar11[-7] = -0x5a;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          PaUtil_DebugPrint(pcVar32);
          return paUtilErr_;
        }
        builtin_strncpy(acStack_130 + lVar4 + lVar1,"ϟ\x10",4);
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar8 = snd_ctl_pcm_next_device(uVar5,(long)&ctl + 4);
        pcVar13 = pcVar32;
        if (-1 < ctl._4_4_ && iVar8 == 0) {
          do {
            pcVar32 = local_70;
            pcVar11[-8] = '\x11';
            pcVar11[-7] = -0x60;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            snprintf((char *)&local_e8,0x32,"%s%s,%d",pcVar32,acStack_130 + 8);
            iVar8 = ctl._4_4_;
            pcVar11[-8] = '\x1c';
            pcVar11[-7] = -0x60;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            snd_pcm_info_set_device(pcVar15,iVar8);
            pcVar11[-8] = '&';
            pcVar11[-7] = -0x60;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            snd_pcm_info_set_subdevice(pcVar15,0);
            pcVar11[-8] = '3';
            pcVar11[-7] = -0x60;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            snd_pcm_info_set_stream(pcVar15,1);
            uVar5 = local_48;
            pcVar11[-8] = '?';
            pcVar11[-7] = -0x60;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            uVar9 = snd_ctl_pcm_info(uVar5,pcVar15);
            pcVar11[-8] = 'L';
            pcVar11[-7] = -0x60;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            snd_pcm_info_set_stream(pcVar15,0);
            uVar5 = local_48;
            pcVar11[-8] = 'X';
            pcVar11[-7] = -0x60;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            uVar10 = snd_ctl_pcm_info(uVar5,pcVar15);
            pcVar32 = pcVar13;
            if (-1 < (int)(uVar10 & uVar9)) {
              cardName = (char *)CONCAT44(cardName._4_4_,uVar10);
              pcVar11[-8] = 'l';
              pcVar11[-7] = -0x60;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              pbVar14 = (byte *)snd_pcm_info_get_name();
              pbVar7 = local_58;
              bVar30 = *pbVar14;
              bVar29 = *local_58;
              bVar26 = bVar30;
              pbVar27 = local_58;
              while (bVar29 != 0) {
                pbVar28 = pbVar14;
                bVar30 = bVar26;
                bVar29 = bVar26;
                if (bVar26 == 0) {
                  bVar26 = 0;
                  bVar30 = 0;
                }
                else {
                  do {
                    pbVar28 = pbVar28 + 1;
                    if (bVar29 != *pbVar27) break;
                    bVar29 = *pbVar28;
                    if ((bVar29 & 0xdf) == 0) {
                      pbVar14 = pbVar28;
                      bVar30 = bVar29;
                      bVar26 = bVar29;
                    }
                    pbVar27 = pbVar27 + 1;
                  } while (bVar29 != 0);
                }
                do {
                  bVar29 = *pbVar27;
                  if (bVar29 == 0) goto LAB_0010a0cf;
                  pbVar27 = pbVar27 + 1;
                } while (bVar29 != 0x20);
                bVar29 = *pbVar27;
              }
LAB_0010a0cf:
              pbVar27 = (byte *)"-";
              if (bVar30 != 0) {
                while (bVar30 == 0x20) {
                  pbVar27 = pbVar14 + 1;
                  pbVar14 = pbVar14 + 1;
                  bVar30 = *pbVar27;
                }
                if ((bVar30 == 0x2d) || (pbVar27 = pbVar14, bVar30 == 0x3a)) {
                  pbVar27 = pbVar14 + (ulong)(pbVar14[1] == 0x20) * 2;
                }
              }
              topNode = (snd_config_t *)CONCAT44(topNode._4_4_,uVar9);
              pcVar11[-8] = '*';
              pcVar11[-7] = -0x5f;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              iVar8 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar7,pbVar27,&local_e8);
              pPVar3 = local_60->allocations;
              pcVar11[-8] = 'E';
              pcVar11[-7] = -0x5f;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              pcVar15 = (char *)PaUtil_GroupAllocateMemory(pPVar3,(long)(iVar8 + 1));
              pbVar14 = local_58;
              if (pcVar15 == (char *)0x0) {
                pcVar32 = 
                "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1327\n"
                ;
                goto LAB_0010a68c;
              }
              pcVar11[-8] = 'o';
              pcVar11[-7] = -0x5f;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              snprintf(pcVar15,(long)(iVar8 + 1),"%s: %s (%s)",pbVar14,pbVar27,&local_e8);
              pHVar20 = _devIdx;
              pcVar6 = local_78;
              pcVar32 = pcVar13 + 1;
              if ((_devIdx == (HwDevInfo *)0x0) || (local_78 < pcVar32)) {
                sVar12 = (long)local_78 << 6;
                pcVar11[-8] = -0x68;
                pcVar11[-7] = -0x5f;
                pcVar11[-6] = '\x10';
                pcVar11[-5] = '\0';
                pcVar11[-4] = '\0';
                pcVar11[-3] = '\0';
                pcVar11[-2] = '\0';
                pcVar11[-1] = '\0';
                pHVar20 = (HwDevInfo *)realloc(pHVar20,sVar12);
                if (pHVar20 == (HwDevInfo *)0x0) {
                  pcVar32 = 
                  "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1335\n"
                  ;
                  goto LAB_0010a68c;
                }
                local_78 = (char *)((long)pcVar6 * 2);
                _devIdx = pHVar20;
              }
              alsaApi = local_60;
              pPVar2 = (PaAlsaHostApiRepresentation *)local_60->allocations;
              builtin_strncpy(acStack_130 + lVar4 + lVar1,"͡\x10",4);
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              paUtilErr_ = PaAlsa_StrDup(pPVar2,&local_a8,(char *)&local_e8);
              if (paUtilErr_ < 0) {
                pcVar32 = 
                "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1338\n"
                ;
                goto LAB_0010a676;
              }
              _devIdx[(long)pcVar13].alsaName = local_a8;
              _devIdx[(long)pcVar13].name = pcVar15;
              _devIdx[(long)pcVar13].isPlug = local_7c;
              _devIdx[(long)pcVar13].hasPlayback = -(uint)(-1 < (int)cardName) >> 0x1f;
              _devIdx[(long)pcVar13].hasCapture = -(uint)(-1 < (int)topNode) >> 0x1f;
              pcVar15 = alsaDeviceName;
            }
            uVar5 = local_48;
            pcVar11[-8] = ';';
            pcVar11[-7] = -0x5e;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            iVar8 = snd_ctl_pcm_next_device(uVar5,(long)&ctl + 4);
          } while ((iVar8 == 0) && (pcVar13 = pcVar32, -1 < ctl._4_4_));
        }
        uVar5 = local_48;
        pcVar11[-8] = 'U';
        pcVar11[-7] = -0x5e;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        snd_ctl_close(uVar5);
      }
      pcVar11[-8] = '^';
      pcVar11[-7] = -0x5e;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      iVar8 = snd_card_next(&local_80);
    } while ((iVar8 == 0) && (-1 < local_80));
  }
  if (_snd_config == 0) {
    pcVar11[-8] = -0x76;
    pcVar11[-7] = -0x5e;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    iVar8 = snd_config_update();
    if (iVar8 < 0) {
      pcVar11[-8] = 'L';
      pcVar11[-7] = -0x59;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      BuildDeviceList_cold_4();
      return -9999;
    }
    if (_snd_config == 0) {
      *(code **)(pcVar11 + -8) = CloseStream;
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x54c,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
    }
  }
  pcVar11[-8] = -0x4f;
  pcVar11[-7] = -0x5e;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  iVar8 = snd_config_search(_snd_config,"pcm",&local_90);
  uVar5 = local_90;
  pcVar15 = pcVar32;
  if (-1 < iVar8) {
    builtin_strncpy(acStack_130 + lVar4 + lVar1,"Ţ\x10",4);
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    psVar16 = (snd_config_t *)snd_config_iterator_first(uVar5);
    builtin_strncpy(acStack_130 + lVar4 + lVar1,"Т\x10",4);
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    psVar17 = (snd_config_t *)snd_config_iterator_next(psVar16);
    uVar5 = local_90;
    builtin_strncpy(acStack_130 + lVar4 + lVar1,"ߢ\x10",4);
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    psVar18 = (snd_config_t *)snd_config_iterator_end(uVar5);
    if (psVar16 != psVar18) {
      do {
        local_e8 = "unknown";
        local_58 = (byte *)0x0;
        topNode = psVar17;
        pcVar11[-8] = '\x10';
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        uVar19 = snd_config_iterator_entry(psVar16);
        local_48 = 0;
        pcVar11[-8] = '*';
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar8 = snd_config_search(uVar19,"type",&local_48);
        uVar5 = local_48;
        if (iVar8 < 0) {
          if (iVar8 == -2) goto LAB_0010a353;
          pcVar32 = 
          "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1374\n"
          ;
          pcVar11[-8] = -0x55;
          pcVar11[-7] = -0x5a;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          BuildDeviceList_cold_3();
          uVar22 = extraout_RAX;
LAB_0010a6e0:
          PVar23 = -9999;
          if ((uVar22 & 1) == 0) {
            pcVar11[-8] = -0x12;
            pcVar11[-7] = -0x5a;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            pcVar15 = (char *)snd_strerror(iVar8);
            pcVar11[-8] = -2;
            pcVar11[-7] = -0x5a;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar8,pcVar15);
            PVar23 = -9999;
          }
LAB_0010a71e:
          pcVar11[-8] = '(';
          pcVar11[-7] = -0x59;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          PaUtil_DebugPrint(pcVar32);
          return PVar23;
        }
        pcVar11[-8] = '>';
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar8 = snd_config_get_string(uVar5,&local_e8);
        if (iVar8 < 0) {
          pcVar32 = 
          "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1379\n"
          ;
          pcVar11[-8] = -0x20;
          pcVar11[-7] = -0x5a;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          BuildDeviceList_cold_1();
          uVar22 = extraout_RAX_01;
          goto LAB_0010a6e0;
        }
LAB_0010a353:
        pcVar11[-8] = '_';
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar8 = snd_config_get_id(uVar19,&local_58);
        pbVar14 = local_58;
        if (iVar8 < 0) {
          pcVar32 = 
          "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1381\n"
          ;
          builtin_strncpy(acStack_130 + lVar4 + lVar1,"f\x10",4);
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          BuildDeviceList_cold_2();
          uVar22 = extraout_RAX_00;
          goto LAB_0010a6e0;
        }
        lVar31 = 0;
        do {
          pcVar15 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar31);
          pcVar11[-8] = 'z';
          pcVar11[-7] = -0x5d;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar8 = strcmp((char *)pbVar14,pcVar15);
          psVar16 = topNode;
          if (iVar8 == 0) goto LAB_0010a4f1;
          lVar31 = lVar31 + 8;
        } while (lVar31 != 0x50);
        pPVar3 = alsaApi->allocations;
        local_70 = pcVar32;
        pcVar11[-8] = -0x61;
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        sVar12 = strlen((char *)pbVar14);
        pcVar11[-8] = -0x55;
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        pcVar32 = (char *)PaUtil_GroupAllocateMemory(pPVar3,sVar12 + 6);
        pbVar14 = local_58;
        PVar23 = -0x2708;
        if (pcVar32 == (char *)0x0) {
          pcVar32 = 
          "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1390\n"
          ;
          goto LAB_0010a71e;
        }
        builtin_strncpy(acStack_130 + lVar4 + lVar1,"ȣ\x10",4);
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        strcpy(pcVar32,(char *)pbVar14);
        pbVar14 = local_58;
        pPVar3 = alsaApi->allocations;
        builtin_strncpy(acStack_130 + lVar4 + lVar1,"أ\x10",4);
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        sVar12 = strlen((char *)pbVar14);
        pcVar11[-8] = -0x1c;
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        pcVar15 = (char *)PaUtil_GroupAllocateMemory(pPVar3,sVar12 + 1);
        pbVar14 = local_58;
        if (pcVar15 == (char *)0x0) {
          pcVar32 = 
          "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1393\n"
          ;
          goto LAB_0010a71e;
        }
        pcVar11[-8] = -4;
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        strcpy(pcVar15,(char *)pbVar14);
        pHVar20 = _devIdx;
        pcVar13 = local_78;
        cardName = local_70 + 1;
        if ((_devIdx == (HwDevInfo *)0x0) || (local_78 < cardName)) {
          sVar12 = (long)local_78 << 6;
          pcVar11[-8] = '%';
          pcVar11[-7] = -0x5c;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          pHVar20 = (HwDevInfo *)realloc(pHVar20,sVar12);
          if (pHVar20 == (HwDevInfo *)0x0) {
            pcVar32 = 
            "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1401\n"
            ;
            goto LAB_0010a71e;
          }
          local_78 = (char *)((long)pcVar13 * 2);
          _devIdx = pHVar20;
        }
        psVar16 = topNode;
        if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_0010a4b5:
          _devIdx[(long)local_70].alsaName = pcVar32;
          _devIdx[(long)local_70].name = pcVar15;
          _devIdx[(long)local_70].isPlug = 1;
          _devIdx[(long)local_70].hasPlayback = 1;
          iVar8 = 1;
        }
        else {
          pcVar11[-8] = 'T';
          pcVar11[-7] = -0x5c;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar8 = strcmp(pcVar32,predefinedNames[0].alsaName);
          pHVar20 = predefinedNames;
          if (iVar8 != 0) {
            pHVar20 = predefinedNames;
            do {
              pcVar13 = pHVar20[1].alsaName;
              if (pcVar13 == (char *)0x0) goto LAB_0010a4b5;
              pcVar11[-8] = 'w';
              pcVar11[-7] = -0x5c;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              iVar8 = strcmp(pcVar32,pcVar13);
              pHVar20 = pHVar20 + 1;
            } while (iVar8 != 0);
          }
          _devIdx[(long)local_70].alsaName = pcVar32;
          _devIdx[(long)local_70].name = pcVar15;
          _devIdx[(long)local_70].isPlug = 1;
          _devIdx[(long)local_70].hasPlayback = pHVar20->hasPlayback;
          iVar8 = pHVar20->hasCapture;
        }
        _devIdx[(long)local_70].hasCapture = iVar8;
        alsaApi = local_60;
        pcVar32 = cardName;
LAB_0010a4f1:
        cardName = pcVar32;
        pcVar32 = cardName;
        pcVar11[-8] = -7;
        pcVar11[-7] = -0x5c;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        psVar17 = (snd_config_t *)snd_config_iterator_next(psVar16);
        uVar5 = local_90;
        pcVar11[-8] = '\b';
        pcVar11[-7] = -0x5b;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        psVar18 = (snd_config_t *)snd_config_iterator_end(uVar5);
        pcVar15 = cardName;
      } while (psVar16 != psVar18);
    }
  }
  cardName = pcVar15;
  pcVar32 = cardName;
  pPVar3 = alsaApi->allocations;
  lVar1 = (long)cardName * 8;
  pcVar11[-8] = '/';
  pcVar11[-7] = -0x5b;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  ppPVar21 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar3,lVar1);
  (alsaApi->baseHostApiRep).deviceInfos = ppPVar21;
  if (ppPVar21 == (PaDeviceInfo **)0x0) {
    pcVar32 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1427\n"
    ;
  }
  else {
    pPVar3 = alsaApi->allocations;
    pcVar11[-8] = 'S';
    pcVar11[-7] = -0x5b;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    devInfo = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar3,(long)pcVar32 * 0x60);
    if (devInfo != (PaAlsaDeviceInfo *)0x0) {
      ctl._0_4_ = 0;
      devInfo_00 = devInfo;
      pHVar20 = _devIdx;
      if (pcVar32 == (char *)0x0) {
        pcVar15 = (char *)0x0;
      }
      else {
        do {
          pcVar15 = pHVar20->name;
          pcVar11[-8] = -0x7b;
          pcVar11[-7] = -0x5b;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar8 = strcmp(pcVar15,"dmix");
          if (iVar8 != 0) {
            pcVar11[-8] = -0x68;
            pcVar11[-7] = -0x5b;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            iVar8 = strcmp(pcVar15,"default");
            pPVar2 = local_60;
            uVar9 = local_64;
            if (iVar8 != 0) {
              pcVar11[-8] = -0x4e;
              pcVar11[-7] = -0x5b;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              FillInDevInfo(pPVar2,pHVar20,uVar9,devInfo_00,(int *)&ctl);
              paUtilErr_ = 0;
            }
          }
          pcVar32 = pcVar32 + -1;
          devInfo_00 = devInfo_00 + 1;
          pHVar20 = pHVar20 + 1;
        } while (pcVar32 != (char *)0x0);
        pcVar15 = (char *)(long)(int)ctl;
        pcVar32 = cardName;
      }
      pHVar20 = _devIdx;
      if (pcVar32 <= pcVar15) {
        pcVar11[-8] = 'u';
        pcVar11[-7] = -0x59;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        __assert_fail("devIdx < numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5ad,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      do {
        pcVar15 = pHVar20->name;
        pcVar11[-8] = -4;
        pcVar11[-7] = -0x5b;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar8 = strcmp(pcVar15,"dmix");
        if (iVar8 == 0) {
LAB_0010a613:
          pPVar2 = local_60;
          uVar9 = local_64;
          pcVar11[-8] = ')';
          pcVar11[-7] = -0x5a;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          FillInDevInfo(pPVar2,pHVar20,uVar9,devInfo,(int *)&ctl);
          paUtilErr_ = 0;
        }
        else {
          pcVar11[-8] = '\x0f';
          pcVar11[-7] = -0x5a;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar8 = strcmp(pcVar15,"default");
          if (iVar8 == 0) goto LAB_0010a613;
        }
        __ptr = _devIdx;
        devInfo = devInfo + 1;
        pcVar32 = pcVar32 + -1;
        pHVar20 = pHVar20 + 1;
        if (pcVar32 == (char *)0x0) {
          pcVar11[-8] = 'I';
          pcVar11[-7] = -0x5a;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          free(__ptr);
          (local_60->baseHostApiRep).info.deviceCount = (int)ctl;
          return 0;
        }
      } while( true );
    }
    pcVar32 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
    ;
  }
LAB_0010a68c:
  pcVar11[-8] = -0x6d;
  pcVar11[-7] = -0x5a;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  PaUtil_DebugPrint(pcVar32);
  return -0x2708;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx < numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}